

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
KillDeathRatioIRCCommand::trigger
          (KillDeathRatioIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  long *plVar8;
  double dVar9;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  string msg;
  string playerName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar5 = channel._M_str;
  if (parameters._M_len != 0) {
    pcVar6 = pcVar5;
    lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,pcVar5);
    if (lVar2 != 0) {
      Jupiter::IRC::Client::Channel::getType();
      msg._M_dataplus._M_p = (pointer)&msg.field_2;
      msg._M_string_length = 0;
      msg.field_2._M_local_buf[0] = '\0';
      uVar7 = 0;
      while( true ) {
        RenX::getCore();
        uVar3 = RenX::Core::getServerCount();
        if (uVar3 == uVar7) break;
        uVar3 = RenX::getCore();
        lVar2 = RenX::Core::getServer(uVar3);
        cVar1 = RenX::Server::isLogChanType((int)lVar2);
        if ((cVar1 != '\0') && (*(long *)(lVar2 + 0x20) != 0)) {
          plVar8 = (long *)(lVar2 + 0x10);
          while (plVar8 = (long *)*plVar8, plVar8 != (long *)(lVar2 + 0x10)) {
            rhs._M_str = pcVar6;
            rhs._M_len = (size_t)parameters._M_str;
            sVar4 = jessilib::findi<char,char>
                              ((jessilib *)(plVar8 + 3),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               parameters._M_len,rhs);
            if (sVar4 != 0xffffffffffffffff) {
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&playerName);
              dVar9 = 1.0;
              if (*(uint *)((long)plVar8 + 0x13c) != 0) {
                dVar9 = (double)*(uint *)((long)plVar8 + 0x13c);
              }
              string_printf_abi_cxx11_
                        (&local_50,"\x02%.*s\x02\x03: Kills: %u - Deaths: %u - KDR: %.2f",
                         (double)*(uint *)(plVar8 + 0x27) / dVar9,playerName._M_string_length,
                         playerName._M_dataplus._M_p);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=(&msg,&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              pcVar6 = (char *)msg._M_string_length;
              Jupiter::IRC::Client::sendMessage
                        (source,channel._M_len,pcVar5,msg._M_string_length,msg._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&playerName);
            }
          }
        }
        uVar7 = uVar7 + 1;
      }
      if (msg._M_string_length == 0) {
        Jupiter::IRC::Client::sendNotice
                  (source,nick._M_len,nick._M_str,0x18,"Error: Player not found.");
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    return;
  }
  Jupiter::IRC::Client::sendNotice
            (source,nick._M_len,nick._M_str,0x31,"Error: Too Few Parameters. Syntax: Kills <Player>"
            );
  return;
}

Assistant:

void KillDeathRatioIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, parameters) != std::string::npos) {
							std::string playerName = RenX::getFormattedPlayerName(*node);
							msg = string_printf(IRCBOLD "%.*s" IRCBOLD IRCCOLOR ": Kills: %u - Deaths: %u - KDR: %.2f", playerName.size(),
								playerName.data(), node->kills, node->deaths, static_cast<double>(node->kills) / (node->deaths == 0 ? 1.0f : static_cast<double>(node->deaths)));
							source->sendMessage(channel, msg);
						}
					}
				}
			}
			if (msg.empty())
				source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Kills <Player>"sv);
}